

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_action.cc
# Opt level: O0

void re2c::emit_accept(OutputFile *o,uint32_t ind,bool *readCh,State *s,accept_t *accepts)

{
  size_t sVar1;
  accept_t *paVar2;
  uint32_t uVar3;
  opt_t *poVar4;
  OutputFile *pOVar5;
  State **ppSVar6;
  uint local_a0;
  uint32_t i_2;
  uint local_94;
  uint32_t i_1;
  undefined1 local_88 [4];
  uint32_t i;
  string local_58;
  size_t local_38;
  size_t accepts_size;
  accept_t *accepts_local;
  State *s_local;
  bool *readCh_local;
  OutputFile *pOStack_10;
  uint32_t ind_local;
  OutputFile *o_local;
  
  accepts_size = (size_t)accepts;
  accepts_local = (accept_t *)s;
  s_local = (State *)readCh;
  readCh_local._4_4_ = ind;
  pOStack_10 = o;
  local_38 = uniq_vector_t<const_re2c::State_*>::size(accepts);
  if (local_38 != 0) {
    poVar4 = Opt::operator->((Opt *)&opts);
    pOVar5 = pOStack_10;
    if (poVar4->target != DOT) {
      poVar4 = Opt::operator->((Opt *)&opts);
      InputAPI::stmt_restore_abi_cxx11_(&local_58,&poVar4->input_api,readCh_local._4_4_);
      OutputFile::wstring(pOVar5,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
    pOVar5 = pOStack_10;
    if (((s_local->label).value & 1) != 0) {
      poVar4 = Opt::operator->((Opt *)&opts);
      InputAPI::stmt_peek_abi_cxx11_((string *)local_88,&poVar4->input_api,readCh_local._4_4_);
      OutputFile::wstring(pOVar5,(string *)local_88);
      std::__cxx11::string::~string((string *)local_88);
      *(undefined1 *)&(s_local->label).value = 0;
    }
    pOVar5 = pOStack_10;
    uVar3 = readCh_local._4_4_;
    paVar2 = accepts_local;
    if (local_38 < 2) {
      ppSVar6 = uniq_vector_t<const_re2c::State_*>::operator[]
                          ((uniq_vector_t<const_re2c::State_*> *)accepts_size,0);
      genGoTo(pOVar5,uVar3,(State *)paVar2,*ppSVar6,(bool *)s_local);
    }
    else {
      poVar4 = Opt::operator->((Opt *)&opts);
      sVar1 = local_38;
      if (((poVar4->gFlag & 1U) == 0) ||
         (poVar4 = Opt::operator->((Opt *)&opts), uVar3 = readCh_local._4_4_,
         sVar1 < poVar4->cGotoThreshold)) {
        poVar4 = Opt::operator->((Opt *)&opts);
        if (((poVar4->sFlag & 1U) == 0) &&
           ((local_38 != 2 || (poVar4 = Opt::operator->((Opt *)&opts), poVar4->target == DOT)))) {
          poVar4 = Opt::operator->((Opt *)&opts);
          if (poVar4->target == DOT) {
            for (local_94 = 0; local_94 < local_38; local_94 = local_94 + 1) {
              pOVar5 = OutputFile::wlabel(pOStack_10,
                                          (label_t)*(uint32_t *)
                                                    &(accepts_local->elems).
                                                                                                          
                                                  super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
              pOVar5 = OutputFile::ws(pOVar5," -> ");
              ppSVar6 = uniq_vector_t<const_re2c::State_*>::operator[]
                                  ((uniq_vector_t<const_re2c::State_*> *)accepts_size,
                                   (ulong)local_94);
              OutputFile::wlabel(pOVar5,(label_t)((*ppSVar6)->label).value);
              pOVar5 = OutputFile::ws(pOStack_10," [label=\"yyaccept=");
              pOVar5 = OutputFile::wu32(pOVar5,local_94);
              OutputFile::ws(pOVar5,"\"]\n");
            }
          }
          else {
            pOVar5 = OutputFile::wind(pOStack_10,readCh_local._4_4_);
            pOVar5 = OutputFile::ws(pOVar5,"switch (");
            poVar4 = Opt::operator->((Opt *)&opts);
            pOVar5 = OutputFile::wstring(pOVar5,&poVar4->yyaccept);
            OutputFile::ws(pOVar5,") {\n");
            for (local_a0 = 0; (ulong)local_a0 < local_38 - 1; local_a0 = local_a0 + 1) {
              pOVar5 = OutputFile::wind(pOStack_10,readCh_local._4_4_);
              pOVar5 = OutputFile::ws(pOVar5,"case ");
              pOVar5 = OutputFile::wu32(pOVar5,local_a0);
              OutputFile::ws(pOVar5,": \t");
              pOVar5 = pOStack_10;
              paVar2 = accepts_local;
              ppSVar6 = uniq_vector_t<const_re2c::State_*>::operator[]
                                  ((uniq_vector_t<const_re2c::State_*> *)accepts_size,
                                   (ulong)local_a0);
              genGoTo(pOVar5,0,(State *)paVar2,*ppSVar6,(bool *)s_local);
            }
            pOVar5 = OutputFile::wind(pOStack_10,readCh_local._4_4_);
            OutputFile::ws(pOVar5,"default:\t");
            pOVar5 = pOStack_10;
            paVar2 = accepts_local;
            ppSVar6 = uniq_vector_t<const_re2c::State_*>::operator[]
                                ((uniq_vector_t<const_re2c::State_*> *)accepts_size,local_38 - 1);
            genGoTo(pOVar5,0,(State *)paVar2,*ppSVar6,(bool *)s_local);
            pOVar5 = OutputFile::wind(pOStack_10,readCh_local._4_4_);
            OutputFile::ws(pOVar5,"}\n");
          }
        }
        else {
          emit_accept_binary(pOStack_10,readCh_local._4_4_,(bool *)s_local,(State *)accepts_local,
                             (accept_t *)accepts_size,0,local_38 - 1);
        }
      }
      else {
        readCh_local._4_4_ = readCh_local._4_4_ + 1;
        pOVar5 = OutputFile::wind(pOStack_10,uVar3);
        OutputFile::ws(pOVar5,"{\n");
        uVar3 = readCh_local._4_4_;
        readCh_local._4_4_ = readCh_local._4_4_ + 1;
        pOVar5 = OutputFile::wind(pOStack_10,uVar3);
        pOVar5 = OutputFile::ws(pOVar5,"static void *");
        poVar4 = Opt::operator->((Opt *)&opts);
        pOVar5 = OutputFile::wstring(pOVar5,&poVar4->yytarget);
        pOVar5 = OutputFile::ws(pOVar5,"[");
        pOVar5 = OutputFile::wu64(pOVar5,local_38);
        OutputFile::ws(pOVar5,"] = {\n");
        for (i_1 = 0; i_1 < local_38; i_1 = i_1 + 1) {
          pOVar5 = OutputFile::wind(pOStack_10,readCh_local._4_4_);
          pOVar5 = OutputFile::ws(pOVar5,"&&");
          poVar4 = Opt::operator->((Opt *)&opts);
          pOVar5 = OutputFile::wstring(pOVar5,&poVar4->labelPrefix);
          ppSVar6 = uniq_vector_t<const_re2c::State_*>::operator[]
                              ((uniq_vector_t<const_re2c::State_*> *)accepts_size,(ulong)i_1);
          pOVar5 = OutputFile::wlabel(pOVar5,(label_t)((*ppSVar6)->label).value);
          OutputFile::ws(pOVar5,",\n");
        }
        readCh_local._4_4_ = readCh_local._4_4_ - 1;
        pOVar5 = OutputFile::wind(pOStack_10,readCh_local._4_4_);
        OutputFile::ws(pOVar5,"};\n");
        pOVar5 = OutputFile::wind(pOStack_10,readCh_local._4_4_);
        pOVar5 = OutputFile::ws(pOVar5,"goto *");
        poVar4 = Opt::operator->((Opt *)&opts);
        pOVar5 = OutputFile::wstring(pOVar5,&poVar4->yytarget);
        pOVar5 = OutputFile::ws(pOVar5,"[");
        poVar4 = Opt::operator->((Opt *)&opts);
        pOVar5 = OutputFile::wstring(pOVar5,&poVar4->yyaccept);
        OutputFile::ws(pOVar5,"];\n");
        readCh_local._4_4_ = readCh_local._4_4_ - 1;
        pOVar5 = OutputFile::wind(pOStack_10,readCh_local._4_4_);
        OutputFile::ws(pOVar5,"}\n");
      }
    }
  }
  return;
}

Assistant:

void emit_accept (OutputFile & o, uint32_t ind, bool & readCh, const State * const s, const accept_t & accepts)
{
	const size_t accepts_size = accepts.size ();
	if (accepts_size > 0)
	{
		if (opts->target != opt_t::DOT)
		{
			o.wstring(opts->input_api.stmt_restore (ind));
		}

		if (readCh) // shouldn't be necessary, but might become at some point
		{
			o.wstring(opts->input_api.stmt_peek (ind));
			readCh = false;
		}

		if (accepts_size > 1)
		{
			if (opts->gFlag && accepts_size >= opts->cGotoThreshold)
			{
				o.wind(ind++).ws("{\n");
				o.wind(ind++).ws("static void *").wstring(opts->yytarget).ws("[").wu64(accepts_size).ws("] = {\n");
				for (uint32_t i = 0; i < accepts_size; ++i)
				{
					o.wind(ind).ws("&&").wstring(opts->labelPrefix).wlabel(accepts[i]->label).ws(",\n");
				}
				o.wind(--ind).ws("};\n");
				o.wind(ind).ws("goto *").wstring(opts->yytarget).ws("[").wstring(opts->yyaccept).ws("];\n");
				o.wind(--ind).ws("}\n");
			}
			else if (opts->sFlag || (accepts_size == 2 && opts->target != opt_t::DOT))
			{
				emit_accept_binary (o, ind, readCh, s, accepts, 0, accepts_size - 1);
			}
			else if (opts->target == opt_t::DOT)
			{
				for (uint32_t i = 0; i < accepts_size; ++i)
				{
					o.wlabel(s->label).ws(" -> ").wlabel(accepts[i]->label);
					o.ws(" [label=\"yyaccept=").wu32(i).ws("\"]\n");
				}
			}
			else
			{
				o.wind(ind).ws("switch (").wstring(opts->yyaccept).ws(") {\n");
				for (uint32_t i = 0; i < accepts_size - 1; ++i)
				{
					o.wind(ind).ws("case ").wu32(i).ws(": \t");
					genGoTo(o, 0, s, accepts[i], readCh);
				}
				o.wind(ind).ws("default:\t");
				genGoTo(o, 0, s, accepts[accepts_size - 1], readCh);
				o.wind(ind).ws("}\n");
			}
		}
		else
		{
			// no need to write if statement here since there is only case 0.
			genGoTo(o, ind, s, accepts[0], readCh);
		}
	}
}